

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_objectwriter.h
# Opt level: O1

void __thiscall
google::protobuf::util::converter::JsonObjectWriter::PushObject(JsonObjectWriter *this)

{
  __uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  _Var1;
  Element *pEVar2;
  int iVar3;
  
  pEVar2 = (Element *)operator_new(0x18);
  _Var1._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  .
  super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
  ._M_head_impl =
       (tuple<google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
        )(this->element_)._M_t.
         super___uniq_ptr_impl<google::protobuf::util::converter::JsonObjectWriter::Element,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
         ._M_t.
         super__Tuple_impl<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
         .
         super__Head_base<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_false>
         ._M_head_impl;
  (this->element_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::JsonObjectWriter::Element,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_false>.
  _M_head_impl = (Element *)0x0;
  (pEVar2->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__BaseElement_003c8e30;
  (pEVar2->super_BaseElement).parent_._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::StructuredObjectWriter::BaseElement,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
  ._M_t = _Var1._M_t.
          super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
          .
          super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
          ._M_head_impl;
  if ((_Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
       )_Var1._M_t.
        super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
        .
        super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
        ._M_head_impl == (BaseElement *)0x0) {
    iVar3 = 0;
  }
  else {
    iVar3 = *(int *)&((BaseElement *)
                     ((long)_Var1._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_std::default_delete<google::protobuf::util::converter::StructuredObjectWriter::BaseElement>_>
                            .
                            super__Head_base<0UL,_google::protobuf::util::converter::StructuredObjectWriter::BaseElement_*,_false>
                            ._M_head_impl + 0x10))->_vptr_BaseElement + 1;
  }
  (pEVar2->super_BaseElement).level_ = iVar3;
  (pEVar2->super_BaseElement)._vptr_BaseElement = (_func_int **)&PTR__BaseElement_003c8de0;
  *(undefined2 *)&(pEVar2->super_BaseElement).field_0x14 = 0x101;
  (this->element_)._M_t.
  super___uniq_ptr_impl<google::protobuf::util::converter::JsonObjectWriter::Element,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
  ._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_std::default_delete<google::protobuf::util::converter::JsonObjectWriter::Element>_>
  .super__Head_base<0UL,_google::protobuf::util::converter::JsonObjectWriter::Element_*,_false>.
  _M_head_impl = pEVar2;
  return;
}

Assistant:

void PushObject() {
    element_.reset(new Element(element_.release(), /*is_json_object=*/true));
  }